

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_depth_decomposition.h
# Opt level: O2

ArrayIDIDFunc *
compute_tree_depth_order_of_connected_graph<main::__0>
          (ArrayIDIDFunc *__return_storage_ptr__,ArrayIDIDFunc *tail,ArrayIDIDFunc *head,
          anon_class_8_1_f6d195b4 *compute_separator,int tree_depth_must_be_below)

{
  pointer piVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int node_end;
  int iVar12;
  int best_order_depth;
  int tree_depth_must_be_below_local;
  int order_end;
  ArrayIDIDFunc *local_198;
  ArrayIDIDFunc nd_order;
  ArrayIDIDFunc sub_tail;
  ArrayIDIDFunc best_order;
  ArrayIDFunc<int> depth;
  vector<int,_std::allocator<int>_> separator;
  ArrayIDIDFunc sub_head;
  undefined1 local_108 [24];
  ArrayIDFunc<int> *local_f0;
  ulong local_e8;
  ArrayIDIDFunc *local_e0;
  ArrayIDIDFunc sub_to_super;
  BitIDFunc component_begin;
  vector<int,_std::allocator<int>_> separator_node_depth;
  anon_class_8_1_f6d195b4 *local_88;
  int *local_80;
  int *local_78;
  BitIDFunc is_in_separator;
  ArrayIDIDMultiFunc successor;
  
  iVar4 = (tail->super_ArrayIDFunc<int>).preimage_count_;
  iVar12 = tail->image_count_;
  tree_depth_must_be_below_local = tree_depth_must_be_below;
  if (iVar4 == iVar12 * 2 + -2) {
    compute_tree_depth_order_of_tree<ArrayIDIDFunc,ArrayIDIDFunc>(__return_storage_ptr__,tail,head);
  }
  else if (iVar4 == (iVar12 + -1) * iVar12) {
    identity_permutation(__return_storage_ptr__,iVar12);
  }
  else {
    compute_greedy_order(&best_order,tail,head);
    best_order_depth = compute_tree_depth_of_order(tail,head,&best_order);
    iVar4 = tree_depth_must_be_below_local;
    if (best_order_depth < tree_depth_must_be_below_local) {
      iVar4 = best_order_depth;
    }
    local_198 = head;
    compute_separator_by_running_bfs<std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
              (&separator,tail,head,iVar4 + -1,compute_separator->rand_gen);
    piVar1 = separator.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if (separator.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        separator.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      local_80 = &tree_depth_must_be_below_local;
      local_78 = &best_order_depth;
      iVar4 = tail->image_count_;
      local_88 = compute_separator;
      compute_successor_function<ArrayIDIDFunc,ArrayIDIDFunc>(&successor,tail,local_198);
      compute_in_set_function(&is_in_separator,iVar4,&separator);
      ArrayIDIDFunc::ArrayIDIDFunc(&sub_tail,tail);
      ArrayIDIDFunc::ArrayIDIDFunc(&sub_head,local_198);
      identity_permutation(&sub_to_super,iVar4);
      inplace_remove_nodes_incident_to_node_set<TinyIntIDFunc<1>>
                (&sub_tail,&sub_head,&sub_to_super,&is_in_separator);
      inplace_reorder_nodes_and_arc_in_preorder(&sub_tail,&sub_head,&sub_to_super);
      ArrayIDFunc<int>::ArrayIDFunc(&depth,iVar4);
      local_e8 = (ulong)((long)separator.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar1) >> 2;
      for (lVar8 = 0; (long)depth.preimage_count_ * 4 != lVar8; lVar8 = lVar8 + 4) {
        *(undefined4 *)((long)depth.data_ + lVar8) = 1;
      }
      ArrayIDFunc<int>::ArrayIDFunc(&nd_order.super_ArrayIDFunc<int>,iVar4);
      local_108._16_8_ = &order_end;
      order_end = 0;
      local_108._0_8_ = &local_88;
      nd_order.image_count_ = iVar4;
      local_108._8_8_ = &nd_order;
      local_f0 = &depth;
      TinyIntIDFunc<1>::TinyIntIDFunc(&component_begin,sub_tail.image_count_);
      TinyIntIDFunc<1>::fill(&component_begin,1);
      for (uVar11 = 0;
          (uint)(~(sub_tail.super_ArrayIDFunc<int>.preimage_count_ >> 0x1f) &
                sub_tail.super_ArrayIDFunc<int>.preimage_count_) != uVar11; uVar11 = uVar11 + 1) {
        iVar4 = sub_tail.super_ArrayIDFunc<int>.data_[uVar11];
        if (sub_head.super_ArrayIDFunc<int>.data_[uVar11] < iVar4) {
          component_begin.data_.data_[iVar4 / 0x40] =
               (ulong)((uint)(component_begin.data_.data_[iVar4 / 0x40] >>
                             ((long)iVar4 % 0x40 & 0x3fU)) & 1) << ((long)iVar4 % 0x40 & 0x3fU) ^
               component_begin.data_.data_[iVar4 / 0x40];
        }
      }
      separator_node_depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&sub_tail;
      separator_node_depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&sub_head;
      separator_node_depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&sub_to_super;
      uVar11 = 1;
      uVar10 = 0;
      uVar6 = 0;
      local_e0 = __return_storage_ptr__;
      while( true ) {
        iVar12 = (int)uVar11;
        iVar4 = (int)uVar6;
        if (sub_tail.image_count_ <= iVar12) break;
        if ((component_begin.data_.data_[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0) {
          uVar5 = (ulong)iVar4;
          uVar2 = (ulong)(uint)sub_tail.super_ArrayIDFunc<int>.preimage_count_;
          if (sub_tail.super_ArrayIDFunc<int>.preimage_count_ < iVar4) {
            uVar2 = uVar6;
          }
          for (; uVar6 = uVar2, (long)uVar5 < (long)sub_tail.super_ArrayIDFunc<int>.preimage_count_;
              uVar5 = uVar5 + 1) {
            if (iVar12 <= sub_tail.super_ArrayIDFunc<int>.data_[uVar5]) {
              uVar6 = uVar5 & 0xffffffff;
              break;
            }
            uVar2 = uVar6;
          }
          bVar3 = forall_connected_components_with_nodes_and_arcs_in_preorder<ArrayIDIDFunc,_ArrayIDIDFunc,_ArrayIDIDFunc,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ben-strasser[P]flow-cutter-pace20/src/tree_depth_decomposition.h:285:9)>
                  ::anon_class_32_4_d72f82c3::operator()
                            ((anon_class_32_4_d72f82c3 *)&separator_node_depth,(int)uVar10,iVar12,
                             iVar4,(int)uVar6);
          uVar10 = uVar11;
          if (!bVar3) goto LAB_0012f0a5;
        }
        uVar11 = (ulong)(iVar12 + 1);
      }
      forall_connected_components_with_nodes_and_arcs_in_preorder<ArrayIDIDFunc,_ArrayIDIDFunc,_ArrayIDIDFunc,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ben-strasser[P]flow-cutter-pace20/src/tree_depth_decomposition.h:285:9)>
      ::anon_class_32_4_d72f82c3::operator()
                ((anon_class_32_4_d72f82c3 *)&separator_node_depth,(int)uVar10,sub_tail.image_count_
                 ,iVar4,sub_tail.super_ArrayIDFunc<int>.preimage_count_);
LAB_0012f0a5:
      ArrayIDFunc<unsigned_long>::~ArrayIDFunc(&component_begin.data_);
      __return_storage_ptr__ = local_e0;
      if (nd_order.super_ArrayIDFunc<int>.preimage_count_ != 0) {
        uVar9 = (uint)local_e8;
        std::vector<int,_std::allocator<int>_>::vector
                  (&separator_node_depth,(long)(int)uVar9,(allocator_type *)local_108);
        uVar11 = (ulong)(~((int)uVar9 >> 0x1f) & uVar9);
        for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
          iVar4 = 0;
          for (lVar8 = (long)successor.preimage_to_intermediate.range_begin.data_
                             [separator.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar10]] << 2;
              (long)successor.preimage_to_intermediate.range_begin.data_
                    [(long)separator.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar10] + 1] * 4 != lVar8;
              lVar8 = lVar8 + 4) {
            if (iVar4 < depth.data_
                        [*(int *)((long)successor.intermediate_to_image.super_ArrayIDFunc<int>.data_
                                 + lVar8)]) {
              iVar4 = depth.data_
                      [*(int *)((long)successor.intermediate_to_image.super_ArrayIDFunc<int>.data_ +
                               lVar8)];
            }
          }
          separator_node_depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = iVar4;
        }
        compute_separator_node_order((ArrayIDIDFunc *)local_108,&separator_node_depth);
        for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
          lVar8 = (long)order_end;
          order_end = order_end + 1;
          nd_order.super_ArrayIDFunc<int>.data_[lVar8] =
               separator.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(&((ArrayIDFunc<int> *)local_108._8_8_)->preimage_count_)[uVar10]];
        }
        ArrayIDFunc<int>::~ArrayIDFunc((ArrayIDFunc<int> *)local_108);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&separator_node_depth.super__Vector_base<int,_std::allocator<int>_>);
      }
      ArrayIDFunc<int>::~ArrayIDFunc(&depth);
      ArrayIDFunc<int>::~ArrayIDFunc(&sub_to_super.super_ArrayIDFunc<int>);
      ArrayIDFunc<int>::~ArrayIDFunc(&sub_head.super_ArrayIDFunc<int>);
      ArrayIDFunc<int>::~ArrayIDFunc(&sub_tail.super_ArrayIDFunc<int>);
      ArrayIDFunc<unsigned_long>::~ArrayIDFunc(&is_in_separator.data_);
      ArrayIDIDMultiFunc::~ArrayIDIDMultiFunc(&successor);
      if ((nd_order.super_ArrayIDFunc<int>.preimage_count_ != 0) &&
         (iVar4 = compute_tree_depth_of_order(tail,local_198,&nd_order), iVar4 < best_order_depth))
      {
        ArrayIDIDFunc::operator=(&best_order,&nd_order);
        best_order_depth = iVar4;
      }
      ArrayIDFunc<int>::~ArrayIDFunc(&nd_order.super_ArrayIDFunc<int>);
    }
    piVar7 = best_order.super_ArrayIDFunc<int>.data_;
    iVar4 = best_order.super_ArrayIDFunc<int>.preimage_count_;
    if (tree_depth_must_be_below_local < best_order_depth) {
      iVar4 = 0;
      piVar7 = (int *)0x0;
      best_order.image_count_ = 0;
    }
    else {
      best_order.super_ArrayIDFunc<int>.preimage_count_ = 0;
      best_order.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    }
    (__return_storage_ptr__->super_ArrayIDFunc<int>).preimage_count_ = iVar4;
    (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = piVar7;
    __return_storage_ptr__->image_count_ = best_order.image_count_;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&separator.super__Vector_base<int,_std::allocator<int>_>);
    ArrayIDFunc<int>::~ArrayIDFunc(&best_order.super_ArrayIDFunc<int>);
  }
  return __return_storage_ptr__;
}

Assistant:

ArrayIDIDFunc compute_tree_depth_order_of_connected_graph(
    ArrayIDIDFunc tail, ArrayIDIDFunc head,
    const ComputeSeparator& compute_separator,
    int tree_depth_must_be_below)
{
    assert(tail.preimage_count() == head.preimage_count());
    assert(tail.image_count() == head.image_count());
    assert(is_symmetric(tail, head));

    const int node_count = tail.image_count();
    const int arc_count = tail.preimage_count();
    bool is_tree = (arc_count == 2 * (node_count - 1));
    bool is_clique = (arc_count == (node_count) * (node_count - 1));

    if (is_tree) {
        return compute_tree_depth_order_of_tree(std::move(tail), std::move(head));
    } else if (is_clique) {
        return identity_permutation(node_count);
    } else {
        ArrayIDIDFunc best_order = compute_greedy_order(tail, head);
        int best_order_depth = compute_tree_depth_of_order(tail, head, best_order);

        // If we computed a separator with size tree_depth_must_be_below or more, then the tree depth would also be at least tree_depth_must_be_below as the separator forms a path.
        // If we computed a separator with size best_order_depth or more, then it cannot be better than best_order_depth as the separator forms a path.
        std::vector<int> separator = compute_separator(tail, head, std::min(tree_depth_must_be_below, best_order_depth) - 1);
        if (!separator.empty()) {
            ArrayIDIDFunc nd_order = compute_nested_disection_order_by_splitting_along_separator(
                tail, head, separator,
                [&](ArrayIDIDFunc sub_tail, ArrayIDIDFunc sub_head) {
                    return compute_tree_depth_order_of_connected_graph(std::move(sub_tail), std::move(sub_head), compute_separator, std::min(tree_depth_must_be_below, best_order_depth) - 1);
                });
            if(nd_order.preimage_count() != 0){
                int nd_order_depth = compute_tree_depth_of_order(tail, head, nd_order);
                if (nd_order_depth < best_order_depth) {
                    best_order = std::move(nd_order);
                    best_order_depth = nd_order_depth;
                }
            }
        }

        if(best_order_depth > tree_depth_must_be_below)
            return ArrayIDIDFunc();
        else
            return std::move(best_order);
    }
}